

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RepulsivePower.hpp
# Opt level: O2

void __thiscall OpenMD::RepulsivePower::~RepulsivePower(RepulsivePower *this)

{
  ~RepulsivePower(this);
  operator_delete(this,200);
  return;
}

Assistant:

void setForceField(ForceField* ff) { forceField_ = ff; }